

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void Test<float,_float,_double>::calculateErrorStatistics(Errors *errors)

{
  storage_t sVar1;
  storage_range_t sVar2;
  
  sVar2 = minmax(&errors->values);
  errors->minimum = sVar2.first;
  errors->maximum = sVar2.second;
  sVar1 = mean(&errors->values);
  errors->mean = sVar1;
  sVar1 = median(&errors->values);
  errors->median = sVar1;
  sVar1 = variance(&errors->values);
  errors->variance = sVar1;
  return;
}

Assistant:

static void calculateErrorStatistics(typename Result<input_t, storage_t>::Errors& errors)
    {
        auto minmaxValue = minmax(errors.values);
        errors.minimum = minmaxValue.first;
        errors.maximum = minmaxValue.second;
        errors.mean = mean(errors.values);
        errors.median = median(errors.values);
        errors.variance = variance(errors.values);
    }